

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_name(parser *p)

{
  errr eVar1;
  void *pvVar2;
  undefined2 local_34 [2];
  undefined8 *puStack_30;
  wchar_t index;
  monster_spell *s;
  char *name;
  monster_spell *h;
  parser *p_local;
  
  h = (monster_spell *)p;
  name = (char *)parser_priv(p);
  s = (monster_spell *)parser_getstr((parser *)h,"name");
  eVar1 = grab_name("monster spell",(char *)s,r_info_spell_flags,0x62,(int *)local_34);
  if (eVar1 == 0) {
    puStack_30 = (undefined8 *)mem_zalloc(0x28);
    *puStack_30 = name;
    *(undefined2 *)(puStack_30 + 1) = local_34[0];
    pvVar2 = mem_zalloc(0x40);
    puStack_30[4] = pvVar2;
    parser_setpriv((parser *)h,puStack_30);
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    p_local._4_4_ = PARSE_ERROR_INVALID_SPELL_NAME;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_name(struct parser *p) {
	struct monster_spell *h = parser_priv(p);
	const char *name = parser_getstr(p, "name");
	struct monster_spell *s;
	int index;

	if (grab_name("monster spell", name, r_info_spell_flags,
			N_ELEMENTS(r_info_spell_flags) - 1, &index)) {
		return PARSE_ERROR_INVALID_SPELL_NAME;
	}
	s = mem_zalloc(sizeof(*s));
	s->next = h;
	s->index = index;
	s->level = mem_zalloc(sizeof(*(s->level)));
	parser_setpriv(p, s);
	return PARSE_ERROR_NONE;
}